

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O3

BigInt * __thiscall BigInt::simple_multiply(BigInt *__return_storage_ptr__,BigInt *this,BigInt *b)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  pointer piVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  pointer piVar13;
  ulong uVar14;
  ulong uVar15;
  vector<int,_std::allocator<int>_> temp;
  allocator_type local_91;
  BigInt local_90;
  BigInt local_70;
  string local_50;
  
  BigInt(&local_90,0);
  bVar7 = operator==(this,&local_90);
  bVar8 = true;
  if (!bVar7) {
    BigInt(&local_70,0);
    bVar8 = operator==(b,&local_70);
    if ((void *)CONCAT44(local_70.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         local_70.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_70.value.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                                       local_70.value.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start._0_4_));
    }
  }
  if (local_90.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_90.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (bVar8 == false) {
    iVar9 = get_real_length(this);
    iVar10 = get_real_length(b);
    iVar1 = iVar9 + iVar10;
    local_70.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = 0;
    std::vector<int,_std::allocator<int>_>::vector
              (&local_90.value,(long)iVar1,(value_type_conflict2 *)&local_70,&local_91);
    iVar2 = this->sign;
    iVar3 = b->sign;
    if (0 < iVar9) {
      piVar5 = (this->value).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar6 = (b->value).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar14 = 1;
      piVar13 = local_90.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        if (0 < iVar10) {
          uVar15 = 1;
          do {
            piVar13[uVar15] = piVar13[uVar15] + piVar6[uVar15] * piVar5[uVar14];
            uVar15 = uVar15 + 1;
          } while (iVar10 + 1 != uVar15);
        }
        uVar14 = uVar14 + 1;
        piVar13 = piVar13 + 1;
      } while (uVar14 != iVar9 + 1);
    }
    if (1 < iVar1) {
      uVar14 = 1;
      iVar9 = 0;
      do {
        iVar10 = iVar9;
        if ((ulong)((long)local_90.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_90.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) <= uVar14) {
          local_70.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ = 0;
          if (local_90.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_90.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_90.value,
                       (iterator)
                       local_90.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)&local_70);
          }
          else {
            *local_90.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish = 0;
            local_90.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_90.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        iVar4 = local_90.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar14];
        iVar11 = iVar4 + iVar10;
        iVar9 = iVar11 / 10;
        local_90.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar14] = iVar11 % 10;
        uVar14 = uVar14 + 1;
      } while (((int)uVar14 < iVar1) || ((iVar4 + iVar10) - 10U < 0xffffffed));
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"0","");
    BigInt(__return_storage_ptr__,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    std::vector<int,_std::allocator<int>_>::operator=
              (&__return_storage_ptr__->value,&local_90.value);
    get_real_length(__return_storage_ptr__);
    uVar12 = (uint)((iVar2 == 0) != (iVar3 == 0));
    __return_storage_ptr__->sign = uVar12;
    *(__return_storage_ptr__->value).super__Vector_base<int,_std::allocator<int>_>._M_impl.
     super__Vector_impl_data._M_start = uVar12;
    if (local_90.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_90.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    BigInt(__return_storage_ptr__,0);
  }
  return __return_storage_ptr__;
}

Assistant:

BigInt BigInt::simple_multiply(BigInt& b) {
    if (*this == 0 || b == 0) {
        return BigInt(0);
    }
    int len_a = this->get_real_length();
    int len_b = b.get_real_length();
    vector<int> temp(len_a + len_b, 0);
    bool positive = this->get_positive_sign() == b.get_positive_sign() ? true : false;
    int carry = 0;
    int i, j;
    for (i = 1; i <= len_a; ++i) { // not carry first
        for (j = 1; j <= len_b; ++j) {
            temp[i + j - 1] += this->value[i] * b.value[j];
        }
    }
    i = 1;
    j = 0;
    while (i < (len_a + len_b) || carry != 0) { // calculate carry
        if (i >= temp.size()) {
            temp.push_back(0);
        }
        j = temp[i] + carry;
        temp[i] = j % 10;
        carry = j / 10;
        ++i;
    }
    BigInt ans("0");
    ans.value = temp;
    ans.get_real_length();
    ans.set_sign(positive);
    return ans;
}